

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDF::readObjectInStream(QPDF *this,OffsetBuffer *input,int stream_id,int obj_id)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  qpdf_offset_t __val;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_R8D;
  QPDFObjectHandle QVar1;
  allocator<char> local_1e9;
  pair<QPDFObjectHandle,_bool> local_1e8;
  string local_1d0;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  QPDFExc local_b0;
  
  QPDFParser::parse(&local_1e8,(OffsetBuffer *)CONCAT44(in_register_00000014,stream_id),obj_id,
                    in_R8D,(Tokenizer *)((input->super_InputSource)._vptr_InputSource + 3),
                    (QPDF *)input);
  if (local_1e8.second == true) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (**(code **)(*(long *)(input->super_InputSource)._vptr_InputSource[0x16] + 0x18))();
    std::operator+(&local_f0,__lhs," object stream ");
    std::__cxx11::to_string(&local_110,obj_id);
    std::operator+(&local_d0,&local_f0,&local_110);
    std::__cxx11::to_string(&local_190,in_R8D);
    std::operator+(&local_170,"object ",&local_190);
    std::operator+(&local_150,&local_170," 0, offset ");
    __val = InputSource::getLastOffset((InputSource *)CONCAT44(in_register_00000014,stream_id));
    std::__cxx11::to_string(&local_1b0,__val);
    std::operator+(&local_130,&local_150,&local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"empty object treated as null",&local_1e9);
    QPDFExc::QPDFExc(&local_b0,qpdf_e_damaged_pdf,&local_d0,&local_130,0,&local_1d0);
    warn((QPDF *)input,&local_b0);
    QPDFExc::~QPDFExc(&local_b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1e8.first.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::readObjectInStream(is::OffsetBuffer& input, int stream_id, int obj_id)
{
    auto [object, empty] = QPDFParser::parse(input, stream_id, obj_id, m->tokenizer, *this);
    if (empty) {
        // Nothing in the PDF spec appears to allow empty objects, but they have been encountered in
        // actual PDF files and Adobe Reader appears to ignore them.
        warn(QPDFExc(
            qpdf_e_damaged_pdf,
            m->file->getName() + " object stream " + std::to_string(stream_id),
            +"object " + std::to_string(obj_id) + " 0, offset " +
                std::to_string(input.getLastOffset()),
            0,
            "empty object treated as null"));
    }
    return object;
}